

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateData::FillBoundary
          (StateData *this,Box *bx,FArrayBox *dest,Real time,Geometry *geom,int dest_comp,
          int src_comp,int num_comp)

{
  Box *pBVar1;
  bool bVar2;
  uint uVar3;
  BCRec *pBVar4;
  BndryFunc *pBVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Box *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 in_XMM0_Qa;
  int in_stack_00000008;
  int j;
  int groupsize;
  int sc;
  int dc;
  int i;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcr;
  Box bx_1;
  int dir_3;
  int *dhi_2;
  int *dlo_2;
  int *bxhi_2;
  int *bxlo_2;
  int dir_2;
  int *dhi_1;
  int *dlo_1;
  int *bxhi_1;
  int *bxlo_1;
  int dir_1;
  int *dhi;
  int *dlo;
  int *bxhi;
  int *bxlo;
  int off;
  uint bitval;
  uint typ;
  int dir;
  undefined1 *in_stack_fffffffffffffc08;
  int iVar9;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  int local_3dc;
  int local_3cc;
  int local_39c;
  int local_38c;
  int local_35c;
  int local_34c;
  int local_2e8;
  int local_2d8;
  undefined1 local_2c0 [24];
  uint local_2a8;
  Box local_2a4;
  int local_288;
  int local_284;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  Box *local_268;
  int local_254;
  int *local_250;
  int *local_248;
  int *local_240;
  int *local_238;
  BCRec *local_230;
  BCRec *local_228;
  Box *local_220;
  Box *local_218;
  int local_20c;
  int *local_208;
  int *local_200;
  int *local_1f8;
  int *local_1f0;
  BCRec *local_1e8;
  BCRec *local_1e0;
  Box *local_1d8;
  Box *local_1d0;
  int local_1c4;
  int *local_1c0;
  int *local_1b8;
  int *local_1b0;
  int *local_1a8;
  BCRec *local_1a0;
  BCRec *local_198;
  Box *local_190;
  Box *local_188;
  uint local_17c;
  uint *local_178;
  int local_168;
  uint local_164;
  uint local_160;
  int local_15c;
  Box *local_158;
  uint local_150;
  int local_14c;
  IndexType *local_148;
  int local_13c;
  uint *local_138;
  int local_130;
  int local_12c;
  IntVect *local_128;
  uint local_120;
  int local_11c;
  IndexType *local_118;
  int local_10c;
  uint *local_108;
  int local_fc;
  IndexType *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  IndexType *local_e0;
  int local_d8;
  int local_d4;
  IndexType *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  BCRec *local_b8;
  int local_b0;
  int local_ac;
  BCRec *local_a8;
  int local_a0;
  int local_9c;
  BCRec *local_98;
  int local_8c;
  BCRec *local_88;
  int local_7c;
  BCRec *local_78;
  int local_6c;
  BCRec *local_68;
  int local_60;
  int local_5c;
  BCRec *local_58;
  int local_50;
  int local_4c;
  BCRec *local_48;
  int local_40;
  int local_3c;
  BCRec *local_38;
  int local_2c;
  BCRec *local_28;
  int local_1c;
  BCRec *local_18;
  int local_c;
  BCRec *local_8;
  
  local_288 = in_R9D;
  local_284 = in_R8D;
  local_280 = in_RCX;
  local_278 = in_XMM0_Qa;
  local_270 = in_RDX;
  local_268 = in_RSI;
  local_2a8 = (uint)Box::ixType((Box *)(in_RDI + 0x10));
  local_178 = &local_2a8;
  local_2a4.smallend.vect._0_8_ = *(undefined8 *)(in_RSI->smallend).vect;
  local_2a4._8_8_ = *(undefined8 *)((in_RSI->smallend).vect + 2);
  local_2a4.bigend.vect._4_8_ = *(undefined8 *)((in_RSI->bigend).vect + 1);
  local_2a4.btype.itype = (in_RSI->btype).itype;
  local_158 = &local_2a4;
  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
    local_138 = &local_150;
    local_13c = local_15c;
    local_10c = local_15c;
    local_e8 = local_15c;
    bVar6 = (byte)local_15c;
    local_160 = (uint)((local_2a8 & 1 << (bVar6 & 0x1f)) != 0);
    local_148 = &local_2a4.btype;
    local_14c = local_15c;
    local_fc = local_15c;
    local_ec = local_15c;
    local_164 = (uint)((local_2a4.btype.itype & 1 << (bVar6 & 0x1f)) != 0);
    local_168 = local_160 - local_164;
    local_128 = &local_2a4.bigend;
    local_12c = local_15c;
    local_128->vect[local_15c] = local_168 + local_128->vect[local_15c];
    local_118 = &local_2a4.btype;
    local_11c = local_15c;
    if (local_160 == 0) {
      local_e4 = local_15c;
      local_d8 = local_15c;
      local_2a4.btype.itype = (1 << (bVar6 & 0x1f) ^ 0xffffffffU) & local_2a4.btype.itype;
      local_e0 = local_118;
    }
    else {
      local_d4 = local_15c;
      local_c4 = local_15c;
      local_2a4.btype.itype = 1 << (bVar6 & 0x1f) | local_2a4.btype.itype;
      local_d0 = local_118;
    }
    local_130 = local_168;
    local_120 = local_160;
    local_108 = local_138;
    local_f8 = local_148;
  }
  local_17c = local_2a8;
  local_150 = local_2a8;
  bVar2 = Box::contains((Box *)(in_RDI + 0x10),&local_2a4);
  if (!bVar2) {
    std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x13b578b);
    Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (size_type)in_stack_fffffffffffffc08,(allocator_type *)0x13b57a8);
    std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x13b57b7);
    local_2d8 = 0;
    while (local_2d8 < in_stack_00000008) {
      uVar7 = local_284 + local_2d8;
      iVar8 = local_288 + local_2d8;
      bVar2 = StateDescriptor::primary
                        ((StateDescriptor *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      pBVar1 = local_268;
      iVar9 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
      if (bVar2) {
        uVar3 = StateDescriptor::groupsize
                          ((StateDescriptor *)
                           CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar9);
        pBVar1 = local_268;
        if (in_stack_00000008 < (int)(uVar3 + local_2d8)) {
          pBVar4 = StateDescriptor::getBC
                             ((StateDescriptor *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                              (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_1e8 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                 (size_type)in_stack_fffffffffffffc08);
          iVar9 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
          local_1d0 = pBVar1;
          local_1e0 = pBVar4;
          local_1d8 = (Box *)(in_RDI + 0x10);
          local_1f0 = Box::loVect(pBVar1);
          local_1f8 = Box::hiVect(local_1d0);
          local_200 = Box::loVect(local_1d8);
          local_208 = Box::hiVect(local_1d8);
          for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
            if (local_200[local_20c] < local_1f0[local_20c]) {
              local_38c = 0;
            }
            else {
              local_78 = local_1e0;
              local_7c = local_20c;
              local_38c = local_1e0->bc[local_20c];
            }
            local_ac = local_20c;
            local_a8 = local_1e8;
            local_b0 = local_38c;
            local_1e8->bc[local_20c] = local_38c;
            if (local_1f8[local_20c] < local_208[local_20c]) {
              local_39c = 0;
            }
            else {
              local_18 = local_1e0;
              local_1c = local_20c;
              local_39c = local_1e0->bc[local_20c + 3];
            }
            local_4c = local_20c;
            local_48 = local_1e8;
            local_50 = local_39c;
            local_1e8->bc[local_20c + 3] = local_39c;
          }
          pBVar5 = StateDescriptor::bndryFill
                             ((StateDescriptor *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar9);
          in_stack_fffffffffffffc08 = local_2c0;
          in_stack_fffffffffffffc10 = 0;
          (*pBVar5->_vptr_BndryFunc[5])
                    (local_278,pBVar5,local_268,local_270,(ulong)uVar7,1,local_280,
                     in_stack_fffffffffffffc08,0,iVar8);
          local_2d8 = local_2d8 + 1;
        }
        else {
          for (local_2e8 = 0; pBVar1 = local_268,
              iVar9 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20), local_2e8 < (int)uVar3;
              local_2e8 = local_2e8 + 1) {
            pBVar4 = StateDescriptor::getBC
                               ((StateDescriptor *)
                                CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar9)
            ;
            local_1a0 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                                  ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                   (size_type)in_stack_fffffffffffffc08);
            local_188 = pBVar1;
            local_198 = pBVar4;
            local_190 = (Box *)(in_RDI + 0x10);
            local_1a8 = Box::loVect(pBVar1);
            local_1b0 = Box::hiVect(local_188);
            local_1b8 = Box::loVect(local_190);
            local_1c0 = Box::hiVect(local_190);
            for (local_1c4 = 0; local_1c4 < 3; local_1c4 = local_1c4 + 1) {
              if (local_1b8[local_1c4] < local_1a8[local_1c4]) {
                local_34c = 0;
              }
              else {
                local_88 = local_198;
                local_8c = local_1c4;
                local_34c = local_198->bc[local_1c4];
              }
              local_bc = local_1c4;
              local_b8 = local_1a0;
              local_c0 = local_34c;
              local_1a0->bc[local_1c4] = local_34c;
              if (local_1b0[local_1c4] < local_1c0[local_1c4]) {
                local_35c = 0;
              }
              else {
                local_28 = local_198;
                local_2c = local_1c4;
                local_35c = local_198->bc[local_1c4 + 3];
              }
              local_5c = local_1c4;
              local_58 = local_1a0;
              local_60 = local_35c;
              local_1a0->bc[local_1c4 + 3] = local_35c;
            }
          }
          pBVar5 = StateDescriptor::bndryFill
                             ((StateDescriptor *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar9);
          in_stack_fffffffffffffc08 = local_2c0;
          in_stack_fffffffffffffc10 = 0;
          (*pBVar5->_vptr_BndryFunc[5])
                    (local_278,pBVar5,local_268,local_270,(ulong)uVar7,(ulong)uVar3,local_280,
                     in_stack_fffffffffffffc08,0,iVar8);
          local_2d8 = uVar3 + local_2d8;
        }
      }
      else {
        pBVar4 = StateDescriptor::getBC
                           ((StateDescriptor *)
                            CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar9);
        local_230 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                               (size_type)in_stack_fffffffffffffc08);
        iVar9 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
        local_218 = pBVar1;
        local_228 = pBVar4;
        local_220 = (Box *)(in_RDI + 0x10);
        local_238 = Box::loVect(pBVar1);
        local_240 = Box::hiVect(local_218);
        local_248 = Box::loVect(local_220);
        local_250 = Box::hiVect(local_220);
        for (local_254 = 0; local_254 < 3; local_254 = local_254 + 1) {
          if (local_248[local_254] < local_238[local_254]) {
            local_3cc = 0;
          }
          else {
            local_68 = local_228;
            local_6c = local_254;
            local_3cc = local_228->bc[local_254];
          }
          local_9c = local_254;
          local_98 = local_230;
          local_a0 = local_3cc;
          local_230->bc[local_254] = local_3cc;
          if (local_240[local_254] < local_250[local_254]) {
            local_3dc = 0;
          }
          else {
            local_8 = local_228;
            local_c = local_254;
            local_3dc = local_228->bc[local_254 + 3];
          }
          local_3c = local_254;
          local_38 = local_230;
          local_40 = local_3dc;
          local_230->bc[local_254 + 3] = local_3dc;
        }
        pBVar5 = StateDescriptor::bndryFill
                           ((StateDescriptor *)
                            CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),iVar9);
        in_stack_fffffffffffffc08 = local_2c0;
        in_stack_fffffffffffffc10 = 0;
        (*pBVar5->_vptr_BndryFunc[5])
                  (local_278,pBVar5,local_268,local_270,(ulong)uVar7,1,local_280,
                   in_stack_fffffffffffffc08,0,iVar8);
        local_2d8 = local_2d8 + 1;
      }
    }
    Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x13b625f);
  }
  return;
}

Assistant:

void
StateData::FillBoundary (Box const&      bx,
                         FArrayBox&      dest,
                         Real            time,
                         const Geometry& geom,
                         int             dest_comp,
                         int             src_comp,
                         int             num_comp)
{
    BL_PROFILE("StateData::FillBoundary(geom)");

    if (domain.contains(convert(bx,domain.ixType()))) return;

    Vector<BCRec> bcr(num_comp);

    for (int i = 0; i < num_comp; )
    {
        const int dc  = dest_comp+i;
        const int sc  = src_comp+i;

        if (desc->primary(sc))
        {
            const int groupsize = desc->groupsize(sc);

            BL_ASSERT(groupsize != 0);

            if (groupsize+i <= num_comp)
            {
                for (int j = 0; j < groupsize; j++)
                {
                    amrex::setBC(bx,domain,desc->getBC(sc+j),bcr[j]);
                }
                //
                // Use the "group" boundary fill routine.
                //
                desc->bndryFill(sc)(bx,dest,dc,groupsize,geom,time,bcr,0,sc);
                i += groupsize;
            }
            else
            {
                amrex::setBC(bx,domain,desc->getBC(sc),bcr[0]);
                desc->bndryFill(sc)(bx,dest,dc,1,geom,time,bcr,0,sc);
                i++;
            }
        }
        else
        {
            amrex::setBC(bx,domain,desc->getBC(sc),bcr[0]);
            desc->bndryFill(sc)(bx,dest,dc,1,geom,time,bcr,0,sc);
            i++;
        }
    }
}